

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O1

void __thiscall
leveldb::FindFileTest::Add
          (FindFileTest *this,char *smallest,char *largest,SequenceNumber smallest_seq,
          SequenceNumber largest_seq)

{
  pointer *pppFVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator __position;
  FileMetaData *f;
  FileMetaData *local_80;
  SequenceNumber local_78;
  string local_70;
  ParsedInternalKey local_50;
  
  local_78 = largest_seq;
  local_80 = (FileMetaData *)operator_new(0x58);
  local_80->refs = 0;
  local_80->allowed_seeks = 0x40000000;
  local_80->file_size = 0;
  (local_80->smallest).rep_._M_dataplus._M_p = (pointer)&(local_80->smallest).rep_.field_2;
  (local_80->smallest).rep_._M_string_length = 0;
  (local_80->smallest).rep_.field_2._M_local_buf[0] = '\0';
  (local_80->largest).rep_._M_dataplus._M_p = (pointer)&(local_80->largest).rep_.field_2;
  (local_80->largest).rep_._M_string_length = 0;
  (local_80->largest).rep_.field_2._M_local_buf[0] = '\0';
  local_80->number =
       ((long)(this->files_).
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->files_).
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start >> 3) + 1;
  local_50.user_key.size_ = strlen(smallest);
  paVar2 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50.type = kTypeValue;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  local_50.user_key.data_ = smallest;
  local_50.sequence = smallest_seq;
  AppendInternalKey(&local_70,&local_50);
  std::__cxx11::string::operator=((string *)&local_80->smallest,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_50.user_key.size_ = strlen(largest);
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50.sequence = local_78;
  local_50.type = kTypeValue;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  local_50.user_key.data_ = largest;
  AppendInternalKey(&local_70,&local_50);
  std::__cxx11::string::operator=((string *)&local_80->largest,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  __position._M_current =
       (this->files_).
       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->files_).
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
    _M_realloc_insert<leveldb::FileMetaData*const&>
              ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)
               &this->files_,__position,&local_80);
  }
  else {
    *__position._M_current = local_80;
    pppFVar1 = &(this->files_).
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  return;
}

Assistant:

void Add(const char* smallest, const char* largest,
           SequenceNumber smallest_seq = 100,
           SequenceNumber largest_seq = 100) {
    FileMetaData* f = new FileMetaData;
    f->number = files_.size() + 1;
    f->smallest = InternalKey(smallest, smallest_seq, kTypeValue);
    f->largest = InternalKey(largest, largest_seq, kTypeValue);
    files_.push_back(f);
  }